

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  int iVar3;
  GCObject **ppGVar4;
  long lVar5;
  GCObject *pGVar6;
  uint uVar7;
  
  pgVar1 = L->l_G;
  luaC_runtilstate(L,-5);
  iVar3 = (pgVar1->strt).size;
  if (iVar3 < newsize) {
    if (newsize < -1) goto LAB_0011012c;
    ppGVar4 = (GCObject **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar3 << 3,(long)newsize * 8);
    (pgVar1->strt).hash = ppGVar4;
    iVar3 = (pgVar1->strt).size;
    if (iVar3 < newsize) {
      lVar5 = (long)iVar3;
      do {
        (pgVar1->strt).hash[lVar5] = (GCObject *)0x0;
        lVar5 = lVar5 + 1;
      } while (newsize != lVar5);
    }
  }
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      ppGVar4 = (pgVar1->strt).hash;
      pGVar6 = ppGVar4[lVar5];
      ppGVar4[lVar5] = (GCObject *)0x0;
      if (pGVar6 != (GCObject *)0x0) {
        do {
          pGVar2 = (pGVar6->gch).next;
          uVar7 = (pGVar6->h).sizearray & newsize - 1U;
          (pGVar6->gch).next = (pgVar1->strt).hash[uVar7];
          (pgVar1->strt).hash[uVar7] = pGVar6;
          (pGVar6->gch).marked = (pGVar6->gch).marked & 0xbf;
          pGVar6 = pGVar2;
        } while (pGVar2 != (GCObject *)0x0);
        iVar3 = (pgVar1->strt).size;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  if (newsize < iVar3) {
    if (newsize < -1) {
LAB_0011012c:
      luaM_toobig(L);
    }
    ppGVar4 = (GCObject **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar3 << 3,(long)newsize << 3);
    (pgVar1->strt).hash = ppGVar4;
  }
  (pgVar1->strt).size = newsize;
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  int i;
  stringtable *tb = &G(L)->strt;
  /* cannot resize while GC is traversing strings */
  luaC_runtilstate(L, ~bitmask(GCSsweepstring));
  if (newsize > tb->size) {
    luaM_reallocvector(L, tb->hash, tb->size, newsize, GCObject *);
    for (i = tb->size; i < newsize; i++) tb->hash[i] = NULL;
  }
  /* rehash */
  for (i=0; i<tb->size; i++) {
    GCObject *p = tb->hash[i];
    tb->hash[i] = NULL;
    while (p) {  /* for each node in the list */
      GCObject *next = gch(p)->next;  /* save next */
      unsigned int h = lmod(gco2ts(p)->hash, newsize);  /* new position */
      gch(p)->next = tb->hash[h];  /* chain it */
      tb->hash[h] = p;
      resetoldbit(p);  /* see MOVE OLD rule */
      p = next;
    }
  }
  if (newsize < tb->size) {
    /* shrinking slice must be empty */
    lua_assert(tb->hash[newsize] == NULL && tb->hash[tb->size - 1] == NULL);
    luaM_reallocvector(L, tb->hash, tb->size, newsize, GCObject *);
  }
  tb->size = newsize;
}